

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O2

void __thiscall procxx::pipe_t::pipe_t(pipe_t *this)

{
  uint uVar1;
  
  std::mutex::lock(&pipe_t::mutex);
  pipe((int *)this);
  uVar1 = fcntl((this->pipe_)._M_elems[0],1,0);
  fcntl((this->pipe_)._M_elems[0],2,(ulong)(uVar1 | 1));
  uVar1 = fcntl((this->pipe_)._M_elems[1],1,0);
  fcntl((this->pipe_)._M_elems[1],2,(ulong)(uVar1 | 1));
  pthread_mutex_unlock((pthread_mutex_t *)&pipe_t::mutex);
  return;
}

Assistant:

pipe_t() {
    static std::mutex mutex;
    std::lock_guard<std::mutex> lock{mutex};
    int pipe_result = ::pipe(&pipe_[0]);
    (void)pipe_result;

    auto flags = ::fcntl(pipe_[0], F_GETFD, 0);
    ::fcntl(pipe_[0], F_SETFD, flags | FD_CLOEXEC);

    flags = ::fcntl(pipe_[1], F_GETFD, 0);
    ::fcntl(pipe_[1], F_SETFD, flags | FD_CLOEXEC);
  }